

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O2

void draw_scene(GLFWwindow *window)

{
  (*glad_glClear)(0x4100);
  (*glad_glMatrixMode)(0x1700);
  (*glad_glLoadIdentity)();
  (*glad_glTranslatef)(0.0,0.0,-zoom);
  (*glad_glRotatef)(beta,1.0,0.0,0.0);
  (*glad_glRotatef)(alpha,0.0,0.0,1.0);
  (*glad_glDrawElements)(7,0x2584,0x1405,quad);
  glfwSwapBuffers(window);
  return;
}

Assistant:

void draw_scene(GLFWwindow* window)
{
    // Clear the color and depth buffers
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

    // We don't want to modify the projection matrix
    glMatrixMode(GL_MODELVIEW);
    glLoadIdentity();

    // Move back
    glTranslatef(0.0, 0.0, -zoom);
    // Rotate the view
    glRotatef(beta, 1.0, 0.0, 0.0);
    glRotatef(alpha, 0.0, 0.0, 1.0);

    glDrawElements(GL_QUADS, 4 * QUADNUM, GL_UNSIGNED_INT, quad);

    glfwSwapBuffers(window);
}